

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O2

VarType * __thiscall deqp::ub::VarType::operator=(VarType *this,VarType *other)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  VarType *pVVar4;
  
  if (this != other) {
    if (this->m_type == TYPE_ARRAY) {
      pVVar4 = (this->m_data).array.elementType;
      if (pVVar4 != (VarType *)0x0) {
        ~VarType(pVVar4);
      }
      operator_delete(pVVar4,0x18);
    }
    uVar1 = other->m_type;
    uVar2 = other->m_flags;
    this->m_type = uVar1;
    this->m_flags = uVar2;
    (this->m_data).array.elementType = (VarType *)0x0;
    (this->m_data).array.size = 0;
    if (uVar1 == 1) {
      pVVar4 = (VarType *)operator_new(0x18);
      VarType(pVVar4,(other->m_data).array.elementType);
      (this->m_data).array.elementType = pVVar4;
      (this->m_data).array.size = (other->m_data).array.size;
    }
    else {
      uVar3 = *(undefined8 *)((long)&other->m_data + 8);
      (this->m_data).array.elementType = (other->m_data).array.elementType;
      *(undefined8 *)((long)&this->m_data + 8) = uVar3;
    }
  }
  return this;
}

Assistant:

VarType& VarType::operator=(const VarType& other)
{
	if (this == &other)
		return *this; // Self-assignment.

	if (m_type == TYPE_ARRAY)
		delete m_data.array.elementType;

	m_type  = other.m_type;
	m_flags = other.m_flags;
	m_data  = Data();

	if (m_type == TYPE_ARRAY)
	{
		m_data.array.elementType = new VarType(*other.m_data.array.elementType);
		m_data.array.size		 = other.m_data.array.size;
	}
	else
		m_data = other.m_data;

	return *this;
}